

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O0

addrinfo * nhr_request_connect_getaddr_info(nhr_request_conflict r)

{
  int iVar1;
  int local_68;
  int last_ret;
  int retry_number;
  int ret;
  addrinfo *result;
  char portstr [12];
  addrinfo hints;
  nhr_request_conflict r_local;
  
  _retry_number = (addrinfo *)0x0;
  local_68 = 0;
  sprintf((char *)((long)&result + 4),"%i",(ulong)r->port);
  while( true ) {
    local_68 = local_68 + 1;
    if (4 < local_68) {
      r->error_code = nhr_error_code_failed_connect_to_host;
      nhr_request_set_command(r,6);
      return (addrinfo *)0x0;
    }
    _retry_number = (addrinfo *)0x0;
    memset(portstr + 4,0,0x30);
    portstr[8] = '\0';
    portstr[9] = '\0';
    portstr[10] = '\0';
    portstr[0xb] = '\0';
    iVar1 = getaddrinfo(r->host,(char *)((long)&result + 4),(addrinfo *)(portstr + 4),
                        (addrinfo **)&retry_number);
    if ((iVar1 == 0) && (_retry_number != (addrinfo *)0x0)) break;
    if (_retry_number != (addrinfo *)0x0) {
      freeaddrinfo(_retry_number);
    }
    nhr_thread_sleep(200);
  }
  return (addrinfo *)_retry_number;
}

Assistant:

struct addrinfo * nhr_request_connect_getaddr_info(nhr_request r) {
	struct addrinfo hints;
	char portstr[12];
	struct addrinfo * result = NULL;
	int ret = 0, retry_number = 0, last_ret = 0;
#if defined(NHR_OS_WINDOWS)
	WSADATA wsa;
	memset(&wsa, 0, sizeof(WSADATA));
	if (WSAStartup(MAKEWORD(2, 2), &wsa) != 0) {
		r->error_code = nhr_error_code_failed_connect_to_host;
		nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
		return NULL;
	}
#endif

	nhr_sprintf(portstr, 12, "%i", r->port);
	while (++retry_number < NHR_CONNECT_ATTEMPS) {
		result = NULL;
		memset(&hints, 0, sizeof(hints));
		hints.ai_family = AF_UNSPEC;
		hints.ai_socktype = SOCK_STREAM;

		ret = getaddrinfo(r->host, portstr, &hints, &result);
		if (ret == 0 && result) {
			return result;
		}

		if (ret != 0) {
			last_ret = ret;
		}
		if (result) {
			freeaddrinfo(result);
		}
		nhr_thread_sleep(NHR_CONNECT_RETRY_DELAY);
	}

#if defined(NHR_OS_WINDOWS)
	WSACleanup();
#endif

	r->error_code = nhr_error_code_failed_connect_to_host;
	nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
	return NULL;
}